

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void setSectorSize(Pager *pPager)

{
  uint uVar1;
  u32 uVar2;
  Pager *pPager_local;
  
  if ((pPager->tempFile == '\0') &&
     (uVar1 = sqlite3OsDeviceCharacteristics(pPager->fd), (uVar1 & 0x1000) == 0)) {
    uVar2 = sqlite3SectorSize(pPager->fd);
    pPager->sectorSize = uVar2;
    return;
  }
  pPager->sectorSize = 0x200;
  return;
}

Assistant:

static void setSectorSize(Pager *pPager){
  assert( isOpen(pPager->fd) || pPager->tempFile );

  if( pPager->tempFile
   || (sqlite3OsDeviceCharacteristics(pPager->fd) &
              SQLITE_IOCAP_POWERSAFE_OVERWRITE)!=0
  ){
    /* Sector size doesn't matter for temporary files. Also, the file
    ** may not have been opened yet, in which case the OsSectorSize()
    ** call will segfault. */
    pPager->sectorSize = 512;
  }else{
    pPager->sectorSize = sqlite3SectorSize(pPager->fd);
  }
}